

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextEngineTests.cpp
# Opt level: O0

void __thiscall
agge::tests::TextEngineTests::GarbageFontIsReusedForTheSameRequest(TextEngineTests *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  element_type *actual;
  path_point (*in_RDX) [3];
  glyph *local_920;
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *local_908;
  allocator local_851;
  string local_850;
  LocationInfo local_830;
  uint local_808;
  allocator local_801;
  string local_800;
  LocationInfo local_7e0;
  allocator local_7b1;
  string local_7b0;
  LocationInfo local_790;
  element_type *local_768;
  allocator local_759;
  string local_758;
  font_descriptor local_738;
  undefined1 local_710 [24];
  string local_6f8;
  LocationInfo local_6d8;
  allocator local_6a9;
  string local_6a8;
  LocationInfo local_688;
  element_type *local_660;
  allocator local_651;
  string local_650;
  font_descriptor local_630;
  undefined1 local_608 [16];
  element_type *local_5f8;
  void *pvf2;
  void *pvf1;
  string local_5e0;
  font_descriptor local_5c0;
  undefined1 local_598 [8];
  ptr f2;
  string local_580;
  font_descriptor local_560;
  undefined1 local_538 [8];
  ptr f1;
  logging_text_engine e;
  fonts_loader loader;
  font_accessor local_420;
  allocator local_369;
  string local_368;
  font_descriptor local_348;
  font_accessor local_320;
  allocator local_269;
  string local_268;
  font_descriptor local_248;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_220;
  undefined1 local_218 [8];
  pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> fonts [2];
  undefined1 local_48 [8];
  glyph glyphs [1];
  char_to_index local_18;
  char_to_index indices [1];
  TextEngineTests *this_local;
  
  local_18.symbol = 0x61;
  local_18.index = 0;
  indices[0] = (char_to_index)this;
  mocks::glyph<agge::glyph::path_point_const,3ul>
            ((glyph *)local_48,(mocks *)c_outline_1,5.2,0.0,in_RDX);
  loader.allocated.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 1;
  local_220 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_268,"Arial",&local_269);
  font_descriptor::create(&local_248,&local_268,10,regular,false,hint_strong);
  mocks::font_accessor::font_accessor<1ul,1ul>
            (&local_320,(font_metrics *)&(anonymous_namespace)::c_fm2,
             (char_to_index (*) [1])&local_18,(glyph (*) [1])local_48);
  std::make_pair<agge::font_descriptor,agge::tests::mocks::font_accessor>
            ((pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *)local_218,&local_248,
             &local_320);
  __return_storage_ptr__ =
       &fonts[0].second._allocated.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_220 = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_368,"Tahoma",&local_369);
  font_descriptor::create(&local_348,&local_368,10,bold,false,hint_strong);
  mocks::font_accessor::font_accessor<1ul,1ul>
            (&local_420,(font_metrics *)&(anonymous_namespace)::c_fm2,
             (char_to_index (*) [1])&local_18,(glyph (*) [1])local_48);
  std::make_pair<agge::font_descriptor,agge::tests::mocks::font_accessor>
            ((pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *)
             __return_storage_ptr__,&local_348,&local_420);
  loader.allocated.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  mocks::font_accessor::~font_accessor(&local_420);
  font_descriptor::~font_descriptor(&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator((allocator<char> *)&local_369);
  mocks::font_accessor::~font_accessor(&local_320);
  font_descriptor::~font_descriptor(&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  mocks::fonts_loader::
  fonts_loader<std::pair<agge::font_descriptor,agge::tests::mocks::font_accessor>,2ul>
            ((fonts_loader *)
             &e.deletion_log.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> (*) [2])local_218);
  mocks::logging_text_engine::logging_text_engine
            ((logging_text_engine *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (loader *)
             &e.deletion_log.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_580,"Arial",
             (allocator *)
             ((long)&f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 7));
  font_descriptor::create(&local_560,&local_580,10,regular,false,hint_strong);
  text_engine_base::create_font
            ((text_engine_base *)local_538,
             (font_descriptor *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  font_descriptor::~font_descriptor(&local_560);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&f2.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5e0,"Tahoma",(allocator *)((long)&pvf1 + 7));
  font_descriptor::create(&local_5c0,&local_5e0,10,bold,false,hint_strong);
  text_engine_base::create_font
            ((text_engine_base *)local_598,
             (font_descriptor *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  font_descriptor::~font_descriptor(&local_5c0);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&pvf1 + 7));
  pvf2 = std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::get
                   ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_538);
  local_5f8 = std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_598);
  std::
  vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
  ::clear((vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
           *)&loader);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_538);
  std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,"Tahoma",&local_651);
  font_descriptor::create(&local_630,&local_650,10,bold,false,hint_strong);
  text_engine_base::create_font
            ((text_engine_base *)local_608,
             (font_descriptor *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<agge::font>::operator=
            ((shared_ptr<agge::font> *)local_598,(shared_ptr<agge::font> *)local_608);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_608);
  font_descriptor::~font_descriptor(&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  local_660 = std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_6a9);
  ut::LocationInfo::LocationInfo(&local_688,&local_6a8,0x3a5);
  ut::are_equal<void*,agge::font*>(&local_5f8,&local_660,&local_688);
  ut::LocationInfo::~LocationInfo(&local_688);
  std::__cxx11::string::~string((string *)&local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_6f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,(allocator *)(local_710 + 0x17));
  ut::LocationInfo::LocationInfo(&local_6d8,&local_6f8,0x3a6);
  ut::
  is_empty<std::vector<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>,std::allocator<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>>>>
            ((vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
              *)&loader,&local_6d8);
  ut::LocationInfo::~LocationInfo(&local_6d8);
  std::__cxx11::string::~string((string *)&local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_710 + 0x17));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_758,"Arial",&local_759);
  font_descriptor::create(&local_738,&local_758,10,regular,false,hint_strong);
  text_engine_base::create_font
            ((text_engine_base *)local_710,
             (font_descriptor *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<agge::font>::operator=
            ((shared_ptr<agge::font> *)local_538,(shared_ptr<agge::font> *)local_710);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_710);
  font_descriptor::~font_descriptor(&local_738);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator((allocator<char> *)&local_759);
  local_768 = std::__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2> *)local_538);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_7b0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_7b1);
  ut::LocationInfo::LocationInfo(&local_790,&local_7b0,0x3ac);
  ut::are_equal<void*,agge::font*>(&pvf2,&local_768,&local_790);
  ut::LocationInfo::~LocationInfo(&local_790);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_800,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_801);
  ut::LocationInfo::LocationInfo(&local_7e0,&local_800,0x3ad);
  ut::
  is_empty<std::vector<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>,std::allocator<std::pair<agge::font_descriptor,std::weak_ptr<agge::font::accessor>>>>>
            ((vector<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>,_std::allocator<std::pair<agge::font_descriptor,_std::weak_ptr<agge::font::accessor>_>_>_>
              *)&loader,&local_7e0);
  ut::LocationInfo::~LocationInfo(&local_7e0);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator((allocator<char> *)&local_801);
  text_engine_base::collect
            ((text_engine_base *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  local_808 = 2;
  actual = std::__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<unsigned_long,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )&loader.fonts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_850,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/TextEngineTests.cpp"
             ,&local_851);
  ut::LocationInfo::LocationInfo(&local_830,&local_850,0x3b3);
  ut::are_equal<unsigned_int,unsigned_long>(&local_808,actual,&local_830);
  ut::LocationInfo::~LocationInfo(&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::allocator<char>::~allocator((allocator<char> *)&local_851);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_598);
  std::shared_ptr<agge::font>::~shared_ptr((shared_ptr<agge::font> *)local_538);
  mocks::logging_text_engine::~logging_text_engine
            ((logging_text_engine *)
             &f1.super___shared_ptr<agge::font,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  mocks::fonts_loader::~fonts_loader
            ((fonts_loader *)
             &e.deletion_log.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_908 = (pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *)
              &fonts[1].second._allocated.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  do {
    local_908 = local_908 + -1;
    std::pair<agge::font_descriptor,_agge::tests::mocks::font_accessor>::~pair(local_908);
  } while (local_908 != (pair<agge::font_descriptor,_agge::tests::mocks::font_accessor> *)local_218)
  ;
  local_920 = (glyph *)&glyphs[0].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_920 = local_920 + -1;
    mocks::font_accessor::glyph::~glyph(local_920);
  } while (local_920 != (glyph *)local_48);
  return;
}

Assistant:

test( GarbageFontIsReusedForTheSameRequest )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L'a', 0 }, };
				mocks::font_accessor::glyph glyphs[] = { mocks::glyph(5.2, 0, c_outline_1), };
				pair<font_descriptor, mocks::font_accessor> fonts[] = {
					make_pair(font_descriptor::create("Arial", 10, regular, false, hint_strong),
						mocks::font_accessor(c_fm2, indices, glyphs)),
					make_pair(font_descriptor::create("Tahoma", 10, bold, false, hint_strong),
						mocks::font_accessor(c_fm2, indices, glyphs)),
				};
				mocks::fonts_loader loader(fonts);
				mocks::logging_text_engine e(loader, 1);
				font::ptr f1 = e.create_font(font_descriptor::create("Arial", 10, regular, false, hint_strong));
				font::ptr f2 = e.create_font(font_descriptor::create("Tahoma", 10, bold, false, hint_strong));
				void *pvf1 = f1.get();
				void *pvf2 = f2.get();

				loader.created_log.clear();
				f1.reset();
				f2.reset();

				// ACT
				f2 = e.create_font(font_descriptor::create("Tahoma", 10, bold, false, hint_strong));

				// ASSERT
				assert_equal(pvf2, f2.get());
				assert_is_empty(loader.created_log);

				// ACT
				f1 = e.create_font(font_descriptor::create("Arial", 10, regular, false, hint_strong));

				// ASSERT
				assert_equal(pvf1, f1.get());
				assert_is_empty(loader.created_log);

				// ACT
				e.collect();

				// ASSERT
				assert_equal(2u, *loader.allocated);
			}